

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shunting_yard.cpp
# Opt level: O3

Queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
infix_to_postfix(Queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *__return_storage_ptr__,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *infix)

{
  int iVar1;
  int iVar2;
  pointer pcVar3;
  bool bVar4;
  int *piVar5;
  Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pNVar6;
  pointer pbVar7;
  Queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pQVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> token;
  Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> stack;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  operators;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  List<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_108;
  string local_e8;
  int *local_c8;
  pointer local_c0;
  pointer local_b8;
  string local_b0;
  BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_90;
  string local_50;
  
  BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::BPlusTree(&local_90,false);
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"OR","");
  piVar5 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           ::operator[]((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                         *)&local_90,&local_128);
  *piVar5 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"AND","");
  piVar5 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           ::operator[]((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                         *)&local_90,&local_128);
  *piVar5 = 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,">","");
  piVar5 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           ::operator[]((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                         *)&local_90,&local_128);
  *piVar5 = 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,">=","");
  piVar5 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           ::operator[]((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                         *)&local_90,&local_128);
  *piVar5 = 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"<","");
  piVar5 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           ::operator[]((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                         *)&local_90,&local_128);
  *piVar5 = 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"<=","");
  piVar5 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           ::operator[]((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                         *)&local_90,&local_128);
  *piVar5 = 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"=","");
  piVar5 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           ::operator[]((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                         *)&local_90,&local_128);
  *piVar5 = 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  local_108._size = 0;
  local_108._data =
       (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)0x0
  ;
  local_108._data_back =
       (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)0x0
  ;
  __return_storage_ptr__->_size = 0;
  __return_storage_ptr__->_data =
       (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)0x0
  ;
  __return_storage_ptr__->_data_back =
       (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)0x0
  ;
  pbVar7 = (infix->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_c0 = (infix->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar7 != local_c0) {
    local_c8 = &__return_storage_ptr__->_size;
    do {
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      pcVar3 = (pbVar7->_M_dataplus)._M_p;
      local_b8 = pbVar7;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_128,pcVar3,pcVar3 + pbVar7->_M_string_length);
      string_util::uppercase(&local_e8,&local_128);
      bVar4 = Map::
              Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              ::contains((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                          *)&local_90,&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      if (bVar4) {
        while (local_108._size != 0) {
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          pcVar3 = ((local_108._data)->_item)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,pcVar3,pcVar3 + ((local_108._data)->_item)._M_string_length
                    );
          string_util::uppercase(&local_e8,&local_b0);
          piVar5 = Map::
                   Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                   ::operator[]((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                                 *)&local_90,&local_e8);
          iVar1 = *piVar5;
          string_util::uppercase(&local_50,&local_128);
          piVar5 = Map::
                   Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                   ::operator[]((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                                 *)&local_90,&local_50);
          iVar2 = *piVar5;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          if (iVar1 < iVar2) break;
          List<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          pop_front(&local_e8,&local_108);
          pQVar8 = (Queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&__return_storage_ptr__->_data_back->_next;
          if (__return_storage_ptr__->_data ==
              (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0) {
            pQVar8 = __return_storage_ptr__;
          }
          pNVar6 = LinkedList::insert_head<std::__cxx11::string>(&pQVar8->_data,&local_e8);
          __return_storage_ptr__->_data_back = pNVar6;
          __return_storage_ptr__->_size = __return_storage_ptr__->_size + 1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p);
          }
        }
        LinkedList::insert_head<std::__cxx11::string>(&local_108._data,&local_128);
        piVar5 = &local_108._size;
        if (local_108._data_back ==
            (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x0) {
          local_108._data_back = local_108._data;
          piVar5 = &local_108._size;
        }
      }
      else {
        pQVar8 = (Queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&__return_storage_ptr__->_data_back->_next;
        if (__return_storage_ptr__->_data ==
            (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x0) {
          pQVar8 = __return_storage_ptr__;
        }
        pNVar6 = LinkedList::insert_head<std::__cxx11::string>(&pQVar8->_data,&local_128);
        __return_storage_ptr__->_data_back = pNVar6;
        piVar5 = local_c8;
      }
      *piVar5 = *piVar5 + 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p);
      }
      pbVar7 = local_b8 + 1;
    } while (pbVar7 != local_c0);
    if (local_108._size != 0) {
      do {
        List<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        pop_front(&local_128,&local_108);
        pQVar8 = (Queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&__return_storage_ptr__->_data_back->_next;
        if (__return_storage_ptr__->_data ==
            (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x0) {
          pQVar8 = __return_storage_ptr__;
        }
        pNVar6 = LinkedList::insert_head<std::__cxx11::string>(&pQVar8->_data,&local_128);
        __return_storage_ptr__->_data_back = pNVar6;
        __return_storage_ptr__->_size = __return_storage_ptr__->_size + 1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p);
        }
      } while (local_108._size != 0);
    }
  }
  LinkedList::delete_all<std::__cxx11::string>(&local_108._data);
  BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::~BPlusTree(&local_90);
  return __return_storage_ptr__;
}

Assistant:

Queue<std::string> infix_to_postfix(const std::vector<std::string>& infix) {
    // operator -> precedence
    Map::Map<std::string, int> operators;
    operators["OR"] = 0;
    operators["AND"] = 1;
    operators[">"] = 2;
    operators[">="] = 2;
    operators["<"] = 2;
    operators["<="] = 2;
    operators["="] = 2;

    Stack<std::string> stack;
    Queue<std::string> queue;
    for (auto token : infix) {
        if (!operators.contains(string_util::uppercase(token)))
            queue.push(token);
        else {
            while (!stack.empty() &&
                   operators[string_util::uppercase(stack.top())] >=
                       operators[string_util::uppercase(token)]) {
                queue.push(stack.pop());
            }
            stack.push(token);
        }
    }
    while (!stack.empty()) {
        queue.push(stack.pop());
    }
    #ifdef DEBUG
        std::cout << queue << '\n';
    #endif
    return queue;
}